

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void EmitDebugSectionImpl
               (Data *DI,EmitFuncType EmitFunc,StringRef Sec,
               StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
               *OutputBuffers)

{
  MemoryBuffer *pMVar1;
  size_type *psVar2;
  _Alloc_hider BufferName;
  undefined8 uVar3;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *puVar4;
  StringRef InputData;
  undefined1 local_a0 [8];
  raw_string_ostream DebugInfoStream;
  size_type *local_58;
  string Data;
  
  local_58 = &Data._M_string_length;
  Data._M_dataplus._M_p = (pointer)0x0;
  Data._M_string_length._0_1_ = 0;
  DebugInfoStream.super_raw_ostream.OutBufCur._0_4_ = 1;
  DebugInfoStream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  DebugInfoStream.super_raw_ostream.OutBufStart = (char *)0x0;
  DebugInfoStream.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_a0 = (undefined1  [8])&PTR__raw_string_ostream_01129208;
  DebugInfoStream.super_raw_ostream._32_8_ = &local_58;
  (*EmitFunc)((raw_ostream *)local_a0,DI);
  llvm::raw_ostream::flush((raw_ostream *)local_a0);
  BufferName = Data._M_dataplus;
  psVar2 = local_58;
  if (Data._M_dataplus._M_p != (pointer)0x0) {
    llvm::Twine::Twine((Twine *)&DebugInfoStream.OS,"");
    InputData.Length = (size_t)psVar2;
    InputData.Data = (char *)((long)&Data.field_2 + 8);
    llvm::MemoryBuffer::getMemBufferCopy(InputData,(Twine *)BufferName._M_p);
    puVar4 = llvm::
             StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
             ::operator[](OutputBuffers,Sec);
    uVar3 = Data.field_2._8_8_;
    Data.field_2._8_8_ = 0;
    pMVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
             super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    (puVar4->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)uVar3;
    if (pMVar1 != (MemoryBuffer *)0x0) {
      (*pMVar1->_vptr_MemoryBuffer[1])();
    }
    if (Data.field_2._8_8_ != 0) {
      (**(code **)(*(long *)Data.field_2._8_8_ + 8))();
    }
  }
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_a0);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void
EmitDebugSectionImpl(const DWARFYAML::Data &DI, EmitFuncType EmitFunc,
                     StringRef Sec,
                     StringMap<std::unique_ptr<MemoryBuffer>> &OutputBuffers) {
  std::string Data;
  raw_string_ostream DebugInfoStream(Data);
  EmitFunc(DebugInfoStream, DI);
  DebugInfoStream.flush();
  if (!Data.empty())
    OutputBuffers[Sec] = MemoryBuffer::getMemBufferCopy(Data);
}